

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

ModelWireSegment * __thiscall lsim::ModelWire::segment_at_point(ModelWire *this,Point *p)

{
  bool bVar1;
  reference this_00;
  pointer pMVar2;
  unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *segment;
  const_iterator __end1;
  const_iterator __begin1;
  segment_container_t *__range1;
  Point *p_local;
  ModelWire *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
           ::begin(&this->m_segments);
  segment = (unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *)
            std::
            vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
            ::end(&this->m_segments);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
                                *)&segment);
    if (!bVar1) {
      return (ModelWireSegment *)0x0;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
              ::operator*(&__end1);
    pMVar2 = std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>::
             operator->(this_00);
    bVar1 = ModelWireSegment::point_on_segment(pMVar2,p);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
    ::operator++(&__end1);
  }
  pMVar2 = std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>::
           get(this_00);
  return pMVar2;
}

Assistant:

ModelWireSegment *ModelWire::segment_at_point(const Point &p) const {
    for (const auto &segment : m_segments) {
        if (segment->point_on_segment(p)) {
            return segment.get();
        }
    }

    return nullptr;
}